

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall LogOutput::add(LogOutput *this)

{
  enable_shared_from_this<LogOutput> local_28;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  LogOutput *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&sOutputsMutex);
  std::enable_shared_from_this<LogOutput>::shared_from_this(&local_28);
  Set<std::shared_ptr<LogOutput>_>::insert(&sOutputs,(shared_ptr<LogOutput> *)&local_28);
  std::shared_ptr<LogOutput>::~shared_ptr((shared_ptr<LogOutput> *)&local_28);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void LogOutput::add()
{
    std::lock_guard<std::mutex> lock(sOutputsMutex);
    sOutputs.insert(shared_from_this());
}